

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 VmFrameLink(jx9_vm *pVm,SyString *pName)

{
  VmFrame *pVVar1;
  SyHashEntry *pSStack_38;
  sxi32 rc;
  SyHashEntry *pEntry;
  VmFrame *pFrame;
  VmFrame *pTarget;
  SyString *pName_local;
  jx9_vm *pVm_local;
  
  pSStack_38 = (SyHashEntry *)0x0;
  pVVar1 = pVm->pFrame;
  pEntry = (SyHashEntry *)pVVar1->pParent;
  while ((pEntry != (SyHashEntry *)0x0 &&
         (pSStack_38 = SyHashGet((SyHash *)&pEntry[2].pUserData,pName->zString,pName->nByte),
         pSStack_38 == (SyHashEntry *)0x0))) {
    pEntry = (SyHashEntry *)pEntry->pKey;
  }
  if (pSStack_38 == (SyHashEntry *)0x0) {
    pVm_local._4_4_ = -6;
  }
  else {
    pVm_local._4_4_ =
         SyHashInsert(&pVVar1->hVar,pSStack_38->pKey,pSStack_38->nKeyLen,pSStack_38->pUserData);
  }
  return pVm_local._4_4_;
}

Assistant:

static sxi32 VmFrameLink(jx9_vm *pVm,SyString *pName)
{
	VmFrame *pTarget, *pFrame;
	SyHashEntry *pEntry = 0;
	sxi32 rc;
	/* Point to the upper frame */
	pFrame = pVm->pFrame;
	pTarget = pFrame;
	pFrame = pTarget->pParent;
	while( pFrame ){
		/* Query the current frame */
		pEntry = SyHashGet(&pFrame->hVar, (const void *)pName->zString, pName->nByte);
		if( pEntry ){
			/* Variable found */
			break;
		}		
		/* Point to the upper frame */
		pFrame = pFrame->pParent;
	}
	if( pEntry == 0 ){
		/* Inexistant variable */
		return SXERR_NOTFOUND;
	}
	/* Link to the current frame */
	rc = SyHashInsert(&pTarget->hVar, pEntry->pKey, pEntry->nKeyLen, pEntry->pUserData);
	return rc;
}